

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.cpp
# Opt level: O3

void * __thiscall glslang::TPoolAllocator::allocate(TPoolAllocator *this,size_t numBytes)

{
  TAllocation *pTVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_t sVar4;
  TAllocation *pTVar5;
  tHeader *ptVar6;
  tHeader *ptVar7;
  ulong uVar8;
  size_t *psVar9;
  size_t *__s;
  size_t numBytesToAlloc;
  
  this->numCalls = this->numCalls + 1;
  this->totalBytes = this->totalBytes + numBytes;
  uVar3 = this->pageSize;
  sVar4 = this->currentPageOffset;
  uVar8 = sVar4 + numBytes + 0x38;
  if (uVar3 < uVar8) {
    sVar4 = this->headerSkip;
    uVar8 = numBytes + 0x38 + sVar4;
    if (uVar3 < uVar8) {
      ptVar6 = (tHeader *)operator_new__(uVar8);
      ptVar7 = this->inUseList;
      ptVar6->lastAllocation = (TAllocation *)0x0;
      ptVar6->nextPage = ptVar7;
      ptVar6->pageCount = ((uVar8 + uVar3) - 1) / uVar3;
      this->inUseList = ptVar6;
      this->currentPageOffset = uVar3;
      __s = (size_t *)((long)&ptVar6->lastAllocation + sVar4);
    }
    else {
      ptVar7 = this->freeList;
      if (ptVar7 == (tHeader *)0x0) {
        ptVar7 = (tHeader *)operator_new__(uVar3);
      }
      else {
        this->freeList = ptVar7->nextPage;
      }
      ptVar7->nextPage = this->inUseList;
      ptVar7->pageCount = 1;
      this->inUseList = ptVar7;
      pTVar1 = (TAllocation *)((long)&ptVar7->lastAllocation + sVar4);
      this->currentPageOffset = ~this->alignmentMask & uVar8 + this->alignmentMask;
      psVar9 = (size_t *)((long)&ptVar7->lastAllocation + sVar4);
      __s = psVar9 + 5;
      *psVar9 = numBytes;
      psVar9[1] = (size_t)pTVar1;
      psVar9[2] = 0;
      psVar9[3] = 0xfbfbfbfbfbfbfbfb;
      psVar9[4] = 0xfbfbfbfbfbfbfbfb;
      memset(__s,0xcd,numBytes);
      puVar2 = (undefined8 *)((long)&pTVar1[1].prevAlloc + numBytes);
      *puVar2 = 0xfefefefefefefefe;
      puVar2[1] = 0xfefefefefefefefe;
      ptVar7->lastAllocation = pTVar1;
    }
  }
  else {
    ptVar7 = this->inUseList;
    pTVar1 = (TAllocation *)((long)&ptVar7->lastAllocation + sVar4);
    this->currentPageOffset = ~this->alignmentMask & uVar8 + this->alignmentMask;
    pTVar5 = ptVar7->lastAllocation;
    psVar9 = (size_t *)((long)&ptVar7->lastAllocation + sVar4);
    __s = psVar9 + 5;
    *psVar9 = numBytes;
    psVar9[1] = (size_t)pTVar1;
    psVar9[2] = (size_t)pTVar5;
    psVar9[3] = 0xfbfbfbfbfbfbfbfb;
    psVar9[4] = 0xfbfbfbfbfbfbfbfb;
    memset(__s,0xcd,numBytes);
    puVar2 = (undefined8 *)((long)&pTVar1[1].prevAlloc + numBytes);
    *puVar2 = 0xfefefefefefefefe;
    puVar2[1] = 0xfefefefefefefefe;
    ptVar7->lastAllocation = pTVar1;
  }
  return __s;
}

Assistant:

void* TPoolAllocator::allocate(size_t numBytes)
{
    // If we are using guard blocks, all allocations are bracketed by
    // them: [guardblock][allocation][guardblock].  numBytes is how
    // much memory the caller asked for.  allocationSize is the total
    // size including guard blocks.  In release build,
    // guardBlockSize=0 and this all gets optimized away.
    size_t allocationSize = TAllocation::allocationSize(numBytes);

    //
    // Just keep some interesting statistics.
    //
    ++numCalls;
    totalBytes += numBytes;

    //
    // Do the allocation, most likely case first, for efficiency.
    // This step could be moved to be inline sometime.
    //
    if (currentPageOffset + allocationSize <= pageSize) {
        //
        // Safe to allocate from currentPageOffset.
        //
        unsigned char* memory = reinterpret_cast<unsigned char*>(inUseList) + currentPageOffset;
        currentPageOffset += allocationSize;
        currentPageOffset = (currentPageOffset + alignmentMask) & ~alignmentMask;

        return initializeAllocation(inUseList, memory, numBytes);
    }

    if (allocationSize + headerSkip > pageSize) {
        //
        // Do a multi-page allocation.  Don't mix these with the others.
        // The OS is efficient and allocating and free-ing multiple pages.
        //
        size_t numBytesToAlloc = allocationSize + headerSkip;
        tHeader* memory = reinterpret_cast<tHeader*>(::new char[numBytesToAlloc]);
        if (memory == nullptr)
            return nullptr;

        // Use placement-new to initialize header
        new(memory) tHeader(inUseList, (numBytesToAlloc + pageSize - 1) / pageSize);
        inUseList = memory;

        currentPageOffset = pageSize;  // make next allocation come from a new page

        // No guard blocks for multi-page allocations (yet)
        return reinterpret_cast<void*>(reinterpret_cast<UINT_PTR>(memory) + headerSkip);
    }

    //
    // Need a simple page to allocate from.
    //
    tHeader* memory;
    if (freeList) {
        memory = freeList;
        freeList = freeList->nextPage;
    } else {
        memory = reinterpret_cast<tHeader*>(::new char[pageSize]);
        if (memory == nullptr)
            return nullptr;
    }

    // Use placement-new to initialize header
    new(memory) tHeader(inUseList, 1);
    inUseList = memory;

    unsigned char* ret = reinterpret_cast<unsigned char*>(inUseList) + headerSkip;
    currentPageOffset = (headerSkip + allocationSize + alignmentMask) & ~alignmentMask;

    return initializeAllocation(inUseList, ret, numBytes);
}